

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_set.hpp
# Opt level: O0

void Omega_h::unite_with<int>
               (set<int,_std::less<int>,_std::allocator<int>_> *a,
               set<int,_std::less<int>,_std::allocator<int>_> *b)

{
  bool bVar1;
  reference __x;
  int *x;
  iterator __end0;
  iterator __begin0;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  set<int,_std::less<int>,_std::allocator<int>_> *b_local;
  set<int,_std::less<int>,_std::allocator<int>_> *a_local;
  
  __end0 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(b);
  x = (int *)std::set<int,_std::less<int>,_std::allocator<int>_>::end(b);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&x);
    if (!bVar1) break;
    __x = std::_Rb_tree_const_iterator<int>::operator*(&__end0);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert(a,__x);
    std::_Rb_tree_const_iterator<int>::operator++(&__end0);
  }
  return;
}

Assistant:

void unite_with(std::set<T>& a, std::set<T> const& b) {
  for (auto& x : b) a.insert(x);
}